

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gain_calculator_hoa.cpp
# Opt level: O0

void __thiscall
ear::GainCalculatorHOAImpl::calculate
          (GainCalculatorHOAImpl *this,HOATypeMetadata *metadata,OutputGainMat *direct,
          WarningCB *warning_cb)

{
  undefined1 *this_00;
  Stride<0,_0> *this_01;
  long lVar1;
  ulong uVar2;
  WarningCB *pWVar3;
  bool bVar4;
  int iVar5;
  size_type sVar6;
  size_type sVar7;
  invalid_argument *piVar8;
  const_reference pvVar9;
  adm_error *this_02;
  pointer ppVar10;
  int *piVar11;
  Index rows;
  Index IVar12;
  norm_f_t *in_R9;
  Matrix<double,__1,__1,_0,__1,__1> local_398;
  ColXpr local_380;
  BooleanNotReturnType local_348;
  ColXpr local_338;
  long local_300;
  Index in_i;
  undefined1 local_2e0 [8];
  MatrixXd D_full;
  VectorXi local_2b8;
  Matrix<double,__1,_1,_0,__1,_1> local_2a8;
  Nested local_298;
  Matrix<double,__1,__1,_0,__1,__1> local_290;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
  local_278;
  undefined1 local_268 [8];
  MatrixXd D;
  non_const_type local_248;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
  local_240;
  undefined1 local_218 [8];
  MatrixXd D_virt;
  Matrix<double,__1,_3,_0,__1,_3> local_1f0;
  Matrix<double,__1,_3,_0,__1,_3> local_1e0;
  undefined1 local_1d0 [8];
  MatrixXd Y_virt;
  undefined1 local_1b0 [8];
  Map<const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> m;
  EigenBase<Eigen::Map<const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
  local_190 [8];
  Map<const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> n;
  norm_f_t *norm;
  Warning local_168;
  allocator<char> local_139;
  Warning local_138;
  undefined1 local_109;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  _Self local_c8;
  _Self local_c0;
  const_iterator norm_it;
  string local_b0;
  undefined1 local_8a;
  allocator<char> local_89;
  string local_88;
  ulong local_68;
  size_t i;
  allocator<char> local_49;
  string local_48;
  WarningCB *local_28;
  WarningCB *warning_cb_local;
  OutputGainMat *direct_local;
  HOATypeMetadata *metadata_local;
  GainCalculatorHOAImpl *this_local;
  
  local_28 = warning_cb;
  warning_cb_local = (WarningCB *)direct;
  direct_local = (OutputGainMat *)metadata;
  metadata_local = (HOATypeMetadata *)this;
  sVar6 = std::vector<int,_std::allocator<int>_>::size(&metadata->orders);
  sVar7 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)(direct_local + 3));
  if (sVar6 != sVar7) {
    i._3_1_ = 1;
    piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"orders and degrees must be the same size",&local_49);
    invalid_argument::invalid_argument(piVar8,&local_48);
    i._3_1_ = 0;
    __cxa_throw(piVar8,&invalid_argument::typeinfo,invalid_argument::~invalid_argument);
  }
  local_68 = 0;
  while( true ) {
    uVar2 = local_68;
    sVar6 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)direct_local);
    if (sVar6 <= uVar2) {
      local_c0._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(&)(int,_int),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(&)(int,_int)>_>_>
           ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(&)(int,_int),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(&)(int,_int)>_>_>
                   *)ADM_norm_types_abi_cxx11_,(key_type *)(direct_local + 6));
      local_c8._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(&)(int,_int),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(&)(int,_int)>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(&)(int,_int),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(&)(int,_int)>_>_>
                  *)ADM_norm_types_abi_cxx11_);
      bVar4 = std::operator==(&local_c0,&local_c8);
      pWVar3 = local_28;
      if (bVar4) {
        local_109 = 1;
        this_02 = (adm_error *)__cxa_allocate_exception(0x10);
        std::operator+(&local_108,"unknown normalization type: \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (direct_local + 6));
        std::operator+(&local_e8,&local_108,"\'");
        adm_error::adm_error(this_02,&local_e8);
        local_109 = 0;
        __cxa_throw(this_02,&adm_error::typeinfo,adm_error::~adm_error);
      }
      if (((ulong)direct_local[0xb]._vptr_OutputGainMat & 1) != 0) {
        local_138.code = HOA_SCREENREF_NOT_IMPLEMENTED;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_138.message,"screenRef for HOA is not implemented; ignoring",
                   &local_139);
        std::function<void_(const_ear::Warning_&)>::operator()(pWVar3,&local_138);
        Warning::~Warning(&local_138);
        std::allocator<char>::~allocator(&local_139);
      }
      pWVar3 = local_28;
      if (((double)direct_local[10]._vptr_OutputGainMat != 0.0) ||
         (NAN((double)direct_local[10]._vptr_OutputGainMat))) {
        local_168.code = HOA_NFCREFDIST_NOT_IMPLEMENTED;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_168.message,"nfcRefDist is not implemented; ignoring",
                   (allocator<char> *)((long)&norm + 7));
        std::function<void_(const_ear::Warning_&)>::operator()(pWVar3,&local_168);
        Warning::~Warning(&local_168);
        std::allocator<char>::~allocator((allocator<char> *)((long)&norm + 7));
      }
      ppVar10 = std::
                _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(&)(int,_int)>_>
                ::operator->(&local_c0);
      n.
      super_MapBase<Eigen::Map<const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
      ._16_8_ = ppVar10->second;
      piVar11 = std::vector<int,_std::allocator<int>_>::data
                          ((vector<int,_std::allocator<int>_> *)direct_local);
      sVar6 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)direct_local);
      this_00 = &m.
                 super_MapBase<Eigen::Map<const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                 .field_0x16;
      Eigen::Stride<0,_0>::Stride((Stride<0,_0> *)this_00);
      Eigen::Map<const_Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>::Map
                ((Map<const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)
                 local_190,piVar11,sVar6,(Stride<0,_0> *)this_00);
      piVar11 = std::vector<int,_std::allocator<int>_>::data
                          ((vector<int,_std::allocator<int>_> *)(direct_local + 3));
      sVar6 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)(direct_local + 3));
      this_01 = (Stride<0,_0> *)
                ((long)&Y_virt.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_cols + 6);
      Eigen::Stride<0,_0>::Stride(this_01);
      Eigen::Map<const_Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>::Map
                ((Map<const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)
                 local_1b0,piVar11,sVar6,this_01);
      Eigen::Matrix<double,_-1,_3,_0,_-1,_3>::Matrix(&local_1e0,&this->points);
      Eigen::Matrix<int,-1,1,0,-1,1>::
      Matrix<Eigen::Map<Eigen::Matrix<int,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>>
                ((Matrix<int,_1,1,0,_1,1> *)&local_1f0,local_190);
      Eigen::Matrix<int,-1,1,0,-1,1>::
      Matrix<Eigen::Map<Eigen::Matrix<int,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>>
                ((Matrix<int,_1,1,0,_1,1> *)
                 &D_virt.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                  m_cols,(EigenBase<Eigen::Map<const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                          *)local_1b0);
      hoa::calc_Y_virt<double(*)(int,int)>
                ((MatrixXd *)local_1d0,(hoa *)&local_1e0,&local_1f0,
                 (VectorXi *)
                 &D_virt.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                  m_cols,(VectorXi *)hoa::norm_N3D,in_R9);
      Eigen::Matrix<int,_-1,_1,_0,_-1,_1>::~Matrix
                ((Matrix<int,__1,_1,_0,__1,_1> *)
                 &D_virt.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                  m_cols);
      Eigen::Matrix<int,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<int,__1,_1,_0,__1,_1> *)&local_1f0);
      Eigen::Matrix<double,_-1,_3,_0,_-1,_3>::~Matrix(&local_1e0);
      local_248 = (non_const_type)
                  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
                            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_1d0);
      D.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
           Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>_>::rows
                     ((PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_> *)this);
      Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>>>::operator/
                (&local_240,
                 (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>> *)&local_248,
                 &D.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                  m_cols);
      Eigen::Matrix<double,-1,-1,0,-1,-1>::
      Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const>const>>
                ((Matrix<double,_1,_1,0,_1,_1> *)local_218,
                 (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>_>
                  *)&local_240);
      local_278 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                            ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&this->G_virt,
                             (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_218);
      Eigen::Matrix<double,-1,-1,0,-1,-1>::
      Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
                ((Matrix<double,_1,_1,0,_1,_1> *)local_268,
                 (EigenBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
                  *)&local_278);
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
                (&local_290,(Matrix<double,__1,__1,_0,__1,__1> *)local_1d0);
      hoa::normalize_decode_matrix((MatrixXd *)local_268,&local_290);
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_290);
      Eigen::Matrix<int,-1,1,0,-1,1>::
      Matrix<Eigen::Map<Eigen::Matrix<int,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>>
                ((Matrix<int,_1,1,0,_1,1> *)&local_2b8,local_190);
      Eigen::Matrix<int,-1,1,0,-1,1>::
      Matrix<Eigen::Map<Eigen::Matrix<int,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>>
                ((Matrix<int,_1,1,0,_1,1> *)
                 &D_full.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                  m_cols,(EigenBase<Eigen::Map<const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                          *)local_1b0);
      hoa::normalisation_conversion<double(*)(int,int),double(*)(int,int)>
                ((hoa *)&local_2a8,&local_2b8,
                 (VectorXi *)
                 &D_full.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                  m_cols,hoa::norm_N3D,
                 (norm_f_t *)
                 n.
                 super_MapBase<Eigen::Map<const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                 ._16_8_);
      local_298 = (Nested)Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::asDiagonal
                                    ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                                     &local_2a8);
      Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*=
                ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_268,
                 (EigenBase<Eigen::DiagonalWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)&local_298);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_2a8);
      Eigen::Matrix<int,_-1,_1,_0,_-1,_1>::~Matrix
                ((Matrix<int,__1,_1,_0,__1,_1> *)
                 &D_full.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                  m_cols);
      Eigen::Matrix<int,_-1,_1,_0,_-1,_1>::~Matrix(&local_2b8);
      rows = Eigen::EigenBase<Eigen::Array<bool,_-1,_1,_0,_-1,_1>_>::size
                       ((EigenBase<Eigen::Array<bool,__1,_1,_0,__1,_1>_> *)&this->is_lfe);
      IVar12 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                         ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_268);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Zero
                ((ConstantReturnType *)&in_i,rows,IVar12);
      Eigen::Matrix<double,-1,-1,0,-1,-1>::
      Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
                ((Matrix<double,_1,_1,0,_1,_1> *)local_2e0,
                 (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                  *)&in_i);
      local_300 = 0;
      while( true ) {
        lVar1 = local_300;
        IVar12 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                           ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_268)
        ;
        pWVar3 = warning_cb_local;
        if (IVar12 <= lVar1) break;
        Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                  (&local_338,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_2e0,
                   local_300);
        Eigen::ArrayBase<Eigen::Array<bool,_-1,_1,_0,_-1,_1>_>::operator!
                  (&local_348,(ArrayBase<Eigen::Array<bool,__1,_1,_0,__1,_1>_> *)&this->is_lfe);
        Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                  (&local_380,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_268,
                   local_300);
        mask_write<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_boolean_not_op<bool>,Eigen::Array<bool,_1,1,0,_1,1>const>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>>
                  (&local_338,&local_348,&local_380);
        local_300 = local_300 + 1;
      }
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
                (&local_398,(Matrix<double,__1,__1,_0,__1,__1> *)local_2e0);
      OutputGainMat::write_mat<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                ((OutputGainMat *)pWVar3,&local_398);
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_398);
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                ((Matrix<double,__1,__1,_0,__1,__1> *)local_2e0);
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                ((Matrix<double,__1,__1,_0,__1,__1> *)local_268);
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                ((Matrix<double,__1,__1,_0,__1,__1> *)local_218);
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                ((Matrix<double,__1,__1,_0,__1,__1> *)local_1d0);
      return;
    }
    pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)direct_local,local_68);
    if (*pvVar9 < 0) break;
    pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(direct_local + 3),local_68);
    iVar5 = *pvVar9;
    if (iVar5 < 1) {
      iVar5 = -iVar5;
    }
    pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)direct_local,local_68);
    if (*pvVar9 < iVar5) {
      norm_it._M_node._6_1_ = 1;
      piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,"magnitude of degree must not be greater than order",
                 (allocator<char> *)((long)&norm_it._M_node + 7));
      invalid_argument::invalid_argument(piVar8,&local_b0);
      norm_it._M_node._6_1_ = 0;
      __cxa_throw(piVar8,&invalid_argument::typeinfo,invalid_argument::~invalid_argument);
    }
    local_68 = local_68 + 1;
  }
  local_8a = 1;
  piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"orders must not be negative",&local_89);
  invalid_argument::invalid_argument(piVar8,&local_88);
  local_8a = 0;
  __cxa_throw(piVar8,&invalid_argument::typeinfo,invalid_argument::~invalid_argument);
}

Assistant:

void GainCalculatorHOAImpl::calculate(const HOATypeMetadata &metadata,
                                        OutputGainMat &direct,
                                        const WarningCB &warning_cb) {
    if (metadata.orders.size() != metadata.degrees.size())
      throw invalid_argument("orders and degrees must be the same size");

    for (size_t i = 0; i < metadata.orders.size(); i++) {
      if (metadata.orders[i] < 0)
        throw invalid_argument("orders must not be negative");
      if (std::abs(metadata.degrees[i]) > metadata.orders[i])
        throw invalid_argument(
            "magnitude of degree must not be greater than order");
    }

    auto norm_it = ADM_norm_types.find(metadata.normalization);
    if (norm_it == ADM_norm_types.end())
      throw adm_error("unknown normalization type: '" + metadata.normalization +
                      "'");

    if (metadata.screenRef)
      warning_cb({Warning::Code::HOA_SCREENREF_NOT_IMPLEMENTED,
                  "screenRef for HOA is not implemented; ignoring"});

    if (metadata.nfcRefDist != 0.0)
      warning_cb({Warning::Code::HOA_NFCREFDIST_NOT_IMPLEMENTED,
                  "nfcRefDist is not implemented; ignoring"});

    hoa::norm_f_t &norm = norm_it->second;

    Eigen::Map<const Eigen::VectorXi> n(metadata.orders.data(),
                                        metadata.orders.size());
    Eigen::Map<const Eigen::VectorXi> m(metadata.degrees.data(),
                                        metadata.degrees.size());

    Eigen::MatrixXd Y_virt = hoa::calc_Y_virt(points, n, m, hoa::norm_N3D);
    Eigen::MatrixXd D_virt = Y_virt.transpose() / points.rows();

    Eigen::MatrixXd D = G_virt * D_virt;

    hoa::normalize_decode_matrix(D, Y_virt);

    D *= hoa::normalisation_conversion(n, m, hoa::norm_N3D, norm).asDiagonal();

    Eigen::MatrixXd D_full = Eigen::MatrixXd::Zero(is_lfe.size(), D.cols());
    for (Eigen::Index in_i = 0; in_i < D.cols(); in_i++) {
      mask_write(D_full.col(in_i), !is_lfe, D.col(in_i));
    }

    direct.write_mat(D_full);
  }